

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool __thiscall
ON_ClippingRegion::SetObjectToClipTransformation(ON_ClippingRegion *this,ON_Viewport *viewport)

{
  bool bVar1;
  long lVar2;
  ON_Xform *pOVar3;
  ON_ClippingRegion *pOVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  
  bVar6 = 0;
  bVar1 = ON_Viewport::GetXform(viewport,world_cs,clip_cs,&this->m_xform);
  if (bVar1) {
    bVar1 = ON_Viewport::GetXform(viewport,clip_cs,world_cs,&this->m_inverse_xform);
    if (bVar1) {
      return true;
    }
    lVar2 = 0x10;
    pOVar3 = &ON_Xform::ZeroTransformation;
    pOVar5 = &this->m_inverse_xform;
  }
  else {
    pOVar3 = &ON_Xform::IdentityTransformation;
    pOVar4 = this;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar4->m_xform).m_xform[0][0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pOVar4 = (ON_ClippingRegion *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
    }
    pOVar5 = &this->m_inverse_xform;
    lVar2 = 0x10;
    pOVar3 = &ON_Xform::IdentityTransformation;
  }
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    pOVar5->m_xform[0][0] = pOVar3->m_xform[0][0];
    pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pOVar5 = (ON_Xform *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  return false;
}

Assistant:

bool ON_ClippingRegion::SetObjectToClipTransformation(
  const ON_Viewport& viewport
  )
{
  if (false == viewport.GetXform(
    ON::coordinate_system::world_cs,
    ON::coordinate_system::clip_cs,
    m_xform
    ))
  {
    m_xform = ON_Xform::IdentityTransformation;
    m_inverse_xform = ON_Xform::IdentityTransformation;
    return false;
  }

  if (false == viewport.GetXform(
    ON::coordinate_system::clip_cs,
    ON::coordinate_system::world_cs,
    m_inverse_xform
    ))
  {
    m_inverse_xform = ON_Xform::ZeroTransformation;
    return false;
  }

  return true;
}